

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O0

ssize_t __thiscall
Vault::Sys::Init::read_abi_cxx11_(Init *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url local_38;
  Init *local_18;
  Init *this_local;
  
  local_18 = (Init *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)local_18;
  this_local = this;
  getUrl_abi_cxx11_(&local_38,local_18);
  HttpConsumer::unauthenticated_get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Init::read() {
  return HttpConsumer::unauthenticated_get(client_, getUrl());
}